

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgtool.cpp
# Opt level: O1

Image * denoiseImage(Image *__return_storage_ptr__,Image *in,ImageChannelDesc *Ldesc,
                    Image *varianceImage,ImageChannelDesc *albedoDesc,ImageChannelDesc *zDesc,
                    ImageChannelDesc *deltaZDesc,ImageChannelDesc *nDesc,int halfWidth,int nLevels)

{
  uint *puVar1;
  Tuple2<pbrt::Point2,_int> TVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  byte bVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  bool bVar23;
  bool bVar24;
  bool bVar25;
  bool bVar26;
  bool bVar27;
  bool bVar28;
  bool bVar29;
  bool bVar30;
  bool bVar31;
  bool bVar32;
  bool bVar33;
  undefined8 uVar34;
  undefined8 uVar35;
  ushort uVar36;
  byte bVar37;
  Allocator AVar38;
  float *pfVar39;
  undefined8 *puVar40;
  float *pfVar41;
  uint uVar42;
  int c_1;
  _Alloc_hider _Var43;
  ulong uVar44;
  long *plVar45;
  int c;
  long lVar46;
  Point2i PVar47;
  ushort uVar48;
  undefined1 auVar49 [64];
  undefined1 auVar50 [64];
  undefined1 auVar51 [64];
  undefined1 auVar52 [64];
  undefined1 auVar53 [64];
  undefined1 auVar54 [64];
  undefined1 auVar55 [64];
  undefined1 auVar56 [64];
  undefined1 auVar57 [64];
  undefined1 auVar58 [64];
  undefined1 auVar59 [64];
  undefined1 auVar60 [64];
  undefined1 auVar61 [64];
  undefined1 auVar62 [64];
  undefined1 auVar63 [64];
  undefined1 auVar64 [64];
  undefined1 auVar65 [64];
  undefined1 auVar66 [64];
  Float FVar67;
  undefined1 auVar68 [16];
  undefined1 auVar69 [12];
  undefined1 in_ZMM2 [64];
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  channels;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  channels_00;
  int delta;
  ImageChannelValues L;
  vector<float,_std::allocator<float>_> f;
  ImageChannelValues albedo;
  Image illum;
  long local_350;
  long local_340;
  int local_32c;
  ImageChannelDesc *local_328;
  undefined1 local_320 [16];
  memory_resource local_310 [2];
  undefined1 *local_300;
  size_t local_2f8;
  undefined1 local_2f0 [16];
  long *local_2e0 [2];
  long local_2d0 [2];
  vector<float,_std::allocator<float>_> local_2c0;
  function<void_(long,_long)> local_2a8;
  Image *local_280;
  ImageChannelDesc *local_278;
  ColorEncodingHandle local_270;
  undefined1 local_268 [16];
  undefined1 local_258 [16];
  undefined1 local_248 [32];
  long local_228 [2];
  long local_218 [13];
  polymorphic_allocator<unsigned_char> local_1b0;
  uchar *local_1a8;
  size_t local_1a0;
  size_t local_198;
  polymorphic_allocator<pbrt::Half> local_190;
  Half *local_188;
  size_t local_180;
  size_t local_178;
  polymorphic_allocator<float> local_170;
  float *local_168;
  size_t local_160;
  size_t local_158;
  ColorEncodingHandle local_150;
  undefined1 local_148 [200];
  size_t sStack_80;
  size_t sStack_78;
  polymorphic_allocator<pbrt::Half> local_70;
  undefined1 local_68 [16];
  size_t sStack_58;
  polymorphic_allocator<float> local_50;
  undefined1 local_48 [16];
  size_t sStack_38;
  
  TVar2 = (in->resolution).super_Tuple2<pbrt::Point2,_int>;
  local_268._0_8_ = local_258;
  local_328 = albedoDesc;
  local_280 = varianceImage;
  local_278 = zDesc;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_268,"R","");
  local_248._0_8_ = local_248 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_248,"G","");
  _Var43._M_p = (pointer)local_218;
  local_228[0] = (long)_Var43._M_p;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_228,"B","");
  local_150.
  super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>.
  bits = (TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
          )0;
  AVar38.memoryResource = pstd::pmr::new_delete_resource();
  channels.n = 3;
  channels.ptr = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_268;
  pbrt::Image::Image((Image *)local_148,Float,(Point2i)TVar2,channels,&local_150,AVar38);
  lVar46 = -0x60;
  do {
    if ((long *)_Var43._M_p != *(long **)((long)_Var43._M_p + -0x10)) {
      operator_delete(*(long **)((long)_Var43._M_p + -0x10),*(long *)_Var43._M_p + 1);
    }
    auVar69 = in_ZMM2._4_12_;
    _Var43._M_p = _Var43._M_p + -0x20;
    lVar46 = lVar46 + 0x20;
  } while (lVar46 != 0);
  if (0 < (in->resolution).super_Tuple2<pbrt::Point2,_int>.y) {
    local_340 = 0;
    do {
      if (0 < (in->resolution).super_Tuple2<pbrt::Point2,_int>.x) {
        uVar44 = 0;
        do {
          PVar47.super_Tuple2<pbrt::Point2,_int> =
               (Tuple2<pbrt::Point2,_int>)(local_340 << 0x20 | uVar44);
          pbrt::Image::GetChannels
                    ((ImageChannelValues *)local_268,in,PVar47,local_328,(WrapMode2D)0x200000002);
          pbrt::Image::GetChannels
                    ((ImageChannelValues *)local_320,in,PVar47,Ldesc,(WrapMode2D)0x200000002);
          lVar46 = 0;
          do {
            pfVar41 = (float *)local_268._8_8_;
            if ((float *)local_268._8_8_ == (float *)0x0) {
              pfVar41 = (float *)local_258;
            }
            if (pfVar41[lVar46] <= 0.0) {
              pfVar41 = (float *)local_320._8_8_;
              if ((float *)local_320._8_8_ == (float *)0x0) {
                pfVar41 = (float *)(local_320 + 0x10);
              }
              FVar67 = pfVar41[lVar46];
            }
            else {
              pfVar39 = (float *)local_320._8_8_;
              if ((float *)local_320._8_8_ == (float *)0x0) {
                pfVar39 = (float *)(local_320 + 0x10);
              }
              FVar67 = pfVar39[lVar46] / pfVar41[lVar46];
            }
            pbrt::Image::SetChannel((Image *)local_148,PVar47,(int)lVar46,FVar67);
            lVar46 = lVar46 + 1;
          } while (lVar46 != 3);
          local_2f8 = 0;
          (*(*(_func_int ***)local_320._0_8_)[3])
                    (local_320._0_8_,local_320._8_8_,(long)local_300 << 2,4);
          local_248._8_8_ = 0;
          (**(code **)(*(long *)local_268._0_8_ + 0x18))
                    (local_268._0_8_,local_268._8_8_,local_248._0_8_ << 2,4);
          uVar44 = uVar44 + 1;
        } while ((long)uVar44 < (long)(in->resolution).super_Tuple2<pbrt::Point2,_int>.x);
      }
      auVar69 = in_ZMM2._4_12_;
      local_340 = local_340 + 1;
    } while (local_340 < (in->resolution).super_Tuple2<pbrt::Point2,_int>.y);
  }
  local_268._0_8_ = local_268._0_8_ & 0xffffffff00000000;
  std::vector<float,_std::allocator<float>_>::vector
            (&local_2c0,(long)halfWidth + 1,(value_type *)local_268,(allocator_type *)local_320);
  if (-1 < halfWidth) {
    auVar68._0_4_ = (float)halfWidth;
    auVar68._4_12_ = auVar69;
    auVar49 = vpbroadcastq_avx512f();
    auVar50 = vbroadcastss_avx512f(auVar68);
    auVar51 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar52 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    auVar53 = vbroadcastss_avx512f(ZEXT416(0x40400000));
    auVar54 = vbroadcastss_avx512f(ZEXT416(0xbfb8aa3b));
    auVar55 = vbroadcastss_avx512f(ZEXT416(0x3da1d5b6));
    auVar56 = vbroadcastss_avx512f(ZEXT416(0x3e658299));
    auVar57 = vbroadcastss_avx512f(ZEXT416(0x3f3263b7));
    auVar58 = vbroadcastss_avx512f(ZEXT416(0x3f7ff3bf));
    auVar59 = vpmovsxbd_avx512f(_DAT_0045e4b0);
    lVar46 = 0;
    auVar60 = vpbroadcastd_avx512f(ZEXT416(0x1e));
    auVar61 = vpbroadcastd_avx512f(ZEXT416(0xffffffe2));
    auVar62 = vpbroadcastq_avx512f(ZEXT816(0x10));
    auVar63 = vpbroadcastd_avx512f(ZEXT416(0x10));
    do {
      uVar34 = vpcmpuq_avx512f(auVar52,auVar49,2);
      uVar35 = vpcmpuq_avx512f(auVar51,auVar49,2);
      bVar37 = (byte)uVar35;
      uVar48 = CONCAT11(bVar37,(byte)uVar34);
      auVar64 = vcvtudq2ps_avx512f(auVar59);
      auVar64 = vdivps_avx512f(auVar64,auVar50);
      auVar64 = vmulps_avx512f(auVar64,auVar53);
      auVar64 = vmulps_avx512f(auVar64,auVar54);
      auVar65 = vrndscaleps_avx512f(auVar64,9);
      auVar64 = vsubps_avx512f(auVar64,auVar65);
      auVar65 = vcvttps2dq_avx512f(auVar65);
      auVar66 = vfmadd213ps_avx512f(auVar55,auVar64,auVar56);
      auVar66 = vfmadd213ps_avx512f(auVar66,auVar64,auVar57);
      auVar64 = vfmadd213ps_avx512f(auVar66,auVar64,auVar58);
      auVar66 = vpslld_avx512f(auVar65,0x17);
      auVar64 = vpaddd_avx512f(auVar66,auVar64);
      uVar44 = vpcmpgtd_avx512f(auVar65,auVar60);
      uVar44 = uVar48 & uVar44;
      uVar35 = vpcmpd_avx512f(auVar65,auVar61,1);
      uVar36 = ~(uVar48 & (ushort)uVar35);
      bVar19 = (byte)(uVar36 >> 8);
      auVar65 = vbroadcastss_avx512f(ZEXT416(0x7f800000));
      bVar3 = (bool)((byte)uVar44 & 1);
      bVar5 = (bool)((byte)(uVar44 >> 1) & 1);
      bVar7 = (bool)((byte)(uVar44 >> 2) & 1);
      bVar9 = (bool)((byte)(uVar44 >> 3) & 1);
      bVar11 = (bool)((byte)(uVar44 >> 4) & 1);
      bVar13 = (bool)((byte)(uVar44 >> 5) & 1);
      bVar15 = (bool)((byte)(uVar44 >> 6) & 1);
      bVar17 = (bool)((byte)(uVar44 >> 7) & 1);
      bVar20 = (bool)((byte)(uVar44 >> 8) & 1);
      bVar21 = (bool)((byte)(uVar44 >> 9) & 1);
      bVar23 = (bool)((byte)(uVar44 >> 10) & 1);
      bVar25 = (bool)((byte)(uVar44 >> 0xb) & 1);
      bVar27 = (bool)((byte)(uVar44 >> 0xc) & 1);
      bVar29 = (bool)((byte)(uVar44 >> 0xd) & 1);
      bVar31 = (bool)((byte)(uVar44 >> 0xe) & 1);
      bVar33 = SUB81(uVar44 >> 0xf,0);
      puVar1 = (uint *)((long)local_2c0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_start + lVar46);
      bVar4 = (bool)((byte)uVar34 & 1);
      bVar6 = (bool)((byte)(uVar48 >> 1) & 1);
      bVar8 = (bool)((byte)(uVar48 >> 2) & 1);
      bVar10 = (bool)((byte)(uVar48 >> 3) & 1);
      bVar12 = (bool)((byte)(uVar48 >> 4) & 1);
      bVar14 = (bool)((byte)(uVar48 >> 5) & 1);
      bVar16 = (bool)((byte)(uVar48 >> 6) & 1);
      bVar18 = (bool)((byte)(uVar48 >> 7) & 1);
      bVar22 = (bool)(bVar37 >> 1 & 1);
      bVar24 = (bool)(bVar37 >> 2 & 1);
      bVar26 = (bool)(bVar37 >> 3 & 1);
      bVar28 = (bool)(bVar37 >> 4 & 1);
      bVar30 = (bool)(bVar37 >> 5 & 1);
      bVar32 = (bool)(bVar37 >> 6 & 1);
      *puVar1 = (uint)bVar4 *
                ((uint)bVar3 * auVar65._0_4_ |
                (uint)!bVar3 * (uint)((byte)uVar36 & 1) * auVar64._0_4_) | (uint)!bVar4 * *puVar1;
      puVar1[1] = (uint)bVar6 *
                  ((uint)bVar5 * auVar65._4_4_ |
                  (uint)!bVar5 * (uint)((byte)(uVar36 >> 1) & 1) * auVar64._4_4_) |
                  (uint)!bVar6 * puVar1[1];
      puVar1[2] = (uint)bVar8 *
                  ((uint)bVar7 * auVar65._8_4_ |
                  (uint)!bVar7 * (uint)((byte)(uVar36 >> 2) & 1) * auVar64._8_4_) |
                  (uint)!bVar8 * puVar1[2];
      puVar1[3] = (uint)bVar10 *
                  ((uint)bVar9 * auVar65._12_4_ |
                  (uint)!bVar9 * (uint)((byte)(uVar36 >> 3) & 1) * auVar64._12_4_) |
                  (uint)!bVar10 * puVar1[3];
      puVar1[4] = (uint)bVar12 *
                  ((uint)bVar11 * auVar65._16_4_ |
                  (uint)!bVar11 * (uint)((byte)(uVar36 >> 4) & 1) * auVar64._16_4_) |
                  (uint)!bVar12 * puVar1[4];
      puVar1[5] = (uint)bVar14 *
                  ((uint)bVar13 * auVar65._20_4_ |
                  (uint)!bVar13 * (uint)((byte)(uVar36 >> 5) & 1) * auVar64._20_4_) |
                  (uint)!bVar14 * puVar1[5];
      puVar1[6] = (uint)bVar16 *
                  ((uint)bVar15 * auVar65._24_4_ |
                  (uint)!bVar15 * (uint)((byte)(uVar36 >> 6) & 1) * auVar64._24_4_) |
                  (uint)!bVar16 * puVar1[6];
      puVar1[7] = (uint)bVar18 *
                  ((uint)bVar17 * auVar65._28_4_ |
                  (uint)!bVar17 * (uint)((byte)(uVar36 >> 7) & 1) * auVar64._28_4_) |
                  (uint)!bVar18 * puVar1[7];
      puVar1[8] = (uint)(bVar37 & 1) *
                  ((uint)bVar20 * auVar65._32_4_ |
                  (uint)!bVar20 * (uint)(bVar19 & 1) * auVar64._32_4_) |
                  (uint)!(bool)(bVar37 & 1) * puVar1[8];
      puVar1[9] = (uint)bVar22 *
                  ((uint)bVar21 * auVar65._36_4_ |
                  (uint)!bVar21 * (uint)(bVar19 >> 1 & 1) * auVar64._36_4_) |
                  (uint)!bVar22 * puVar1[9];
      puVar1[10] = (uint)bVar24 *
                   ((uint)bVar23 * auVar65._40_4_ |
                   (uint)!bVar23 * (uint)(bVar19 >> 2 & 1) * auVar64._40_4_) |
                   (uint)!bVar24 * puVar1[10];
      puVar1[0xb] = (uint)bVar26 *
                    ((uint)bVar25 * auVar65._44_4_ |
                    (uint)!bVar25 * (uint)(bVar19 >> 3 & 1) * auVar64._44_4_) |
                    (uint)!bVar26 * puVar1[0xb];
      puVar1[0xc] = (uint)bVar28 *
                    ((uint)bVar27 * auVar65._48_4_ |
                    (uint)!bVar27 * (uint)(bVar19 >> 4 & 1) * auVar64._48_4_) |
                    (uint)!bVar28 * puVar1[0xc];
      puVar1[0xd] = (uint)bVar30 *
                    ((uint)bVar29 * auVar65._52_4_ |
                    (uint)!bVar29 * (uint)(bVar19 >> 5 & 1) * auVar64._52_4_) |
                    (uint)!bVar30 * puVar1[0xd];
      puVar1[0xe] = (uint)bVar32 *
                    ((uint)bVar31 * auVar65._56_4_ |
                    (uint)!bVar31 * (uint)(bVar19 >> 6 & 1) * auVar64._56_4_) |
                    (uint)!bVar32 * puVar1[0xe];
      puVar1[0xf] = (uint)(bVar37 >> 7) *
                    ((uint)bVar33 * auVar65._60_4_ |
                    (uint)!bVar33 * (uint)(bVar19 >> 7) * auVar64._60_4_) |
                    (uint)!(bool)(bVar37 >> 7) * puVar1[0xf];
      auVar52 = vpaddq_avx512f(auVar52,auVar62);
      auVar51 = vpaddq_avx512f(auVar51,auVar62);
      auVar59 = vpaddd_avx512f(auVar59,auVar63);
      lVar46 = lVar46 + 0x40;
    } while ((ulong)((uint)halfWidth >> 4 & 0x7ffffff) * 0x40 + 0x40 != lVar46);
  }
  denoiseImage::call = denoiseImage::call + 1;
  (__return_storage_ptr__->resolution).super_Tuple2<pbrt::Point2,_int>.y = local_148._8_4_;
  __return_storage_ptr__->format = local_148._0_4_;
  (__return_storage_ptr__->resolution).super_Tuple2<pbrt::Point2,_int>.x = local_148._4_4_;
  pbrt::
  InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::InlinedVector(&__return_storage_ptr__->channelNames,
                  (InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)(local_148 + 0x10));
  uVar42 = 0;
  (__return_storage_ptr__->encoding).
  super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>.
  bits = 0;
  (__return_storage_ptr__->encoding).
  super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>.
  bits = local_148._176_8_;
  (__return_storage_ptr__->p8).alloc.memoryResource = (memory_resource *)local_148._184_8_;
  auVar68 = ZEXT816(0) << 0x20;
  (__return_storage_ptr__->p8).ptr = (uchar *)auVar68._0_8_;
  (__return_storage_ptr__->p8).nAlloc = auVar68._8_8_;
  (__return_storage_ptr__->p8).nStored = 0;
  (__return_storage_ptr__->p8).nAlloc = sStack_80;
  (__return_storage_ptr__->p8).nStored = sStack_78;
  (__return_storage_ptr__->p8).ptr = (uchar *)local_148._192_8_;
  sStack_78 = 0;
  (__return_storage_ptr__->p16).alloc.memoryResource = local_70.memoryResource;
  (__return_storage_ptr__->p16).nStored = 0;
  (__return_storage_ptr__->p16).ptr = (Half *)auVar68._0_8_;
  (__return_storage_ptr__->p16).nAlloc = auVar68._8_8_;
  (__return_storage_ptr__->p16).nAlloc = local_68._8_8_;
  (__return_storage_ptr__->p16).nStored = sStack_58;
  (__return_storage_ptr__->p16).ptr = (Half *)local_68._0_8_;
  sStack_58 = 0;
  (__return_storage_ptr__->p32).alloc.memoryResource = local_50.memoryResource;
  (__return_storage_ptr__->p32).nStored = 0;
  (__return_storage_ptr__->p32).ptr = (float *)auVar68._0_8_;
  (__return_storage_ptr__->p32).nAlloc = auVar68._8_8_;
  (__return_storage_ptr__->p32).nAlloc = local_48._8_8_;
  (__return_storage_ptr__->p32).nStored = sStack_38;
  (__return_storage_ptr__->p32).ptr = (float *)local_48._0_8_;
  sStack_38 = 0;
  unique0x10000f56 = auVar68;
  local_68 = auVar68;
  local_48 = auVar68;
  if (0 < nLevels) {
    do {
      local_32c = 1 << (uVar42 & 0x1f);
      TVar2 = (in->resolution).super_Tuple2<pbrt::Point2,_int>;
      local_320._0_8_ = local_320 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_320,"R","");
      local_300 = local_2f0;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_300,"G","");
      local_2e0[0] = local_2d0;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_2e0,"B","");
      local_270.
      super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
      .bits = (TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
               )0;
      AVar38.memoryResource = pstd::pmr::new_delete_resource();
      channels_00.n = 3;
      channels_00.ptr =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_320;
      pbrt::Image::Image((Image *)local_268,Float,(Point2i)TVar2,channels_00,&local_270,AVar38);
      lVar46 = -0x60;
      plVar45 = local_2d0;
      do {
        if (plVar45 != (long *)plVar45[-2]) {
          operator_delete((long *)plVar45[-2],*plVar45 + 1);
        }
        plVar45 = plVar45 + -4;
        lVar46 = lVar46 + 0x20;
      } while (lVar46 != 0);
      TVar2 = (__return_storage_ptr__->resolution).super_Tuple2<pbrt::Point2,_int>;
      local_2a8 = (function<void_(long,_long)>)ZEXT1632(ZEXT816(0) << 0x40);
      puVar40 = (undefined8 *)operator_new(0x50);
      *puVar40 = __return_storage_ptr__;
      puVar40[1] = in;
      puVar40[2] = local_278;
      puVar40[3] = deltaZDesc;
      puVar40[4] = nDesc;
      puVar40[5] = local_280;
      puVar40[6] = &halfWidth;
      puVar40[7] = &local_32c;
      puVar40[8] = &local_2c0;
      puVar40[9] = (Image *)local_268;
      local_2a8.super__Function_base._M_functor._M_unused._M_object = puVar40;
      local_2a8.super__Function_base._M_manager =
           std::
           _Function_handler<void_(long,_long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/imgtool.cpp:1897:53)>
           ::_M_manager;
      local_2a8._M_invoker =
           std::
           _Function_handler<void_(long,_long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/imgtool.cpp:1897:53)>
           ::_M_invoke;
      pbrt::ParallelFor(0,(long)TVar2 >> 0x20,&local_2a8);
      if (local_2a8.super__Function_base._M_manager != (_Manager_type)0x0) {
        (*local_2a8.super__Function_base._M_manager)
                  ((_Any_data *)&local_2a8,(_Any_data *)&local_2a8,__destroy_functor);
      }
      pstd::swap<pbrt::Image>((Image *)local_268,__return_storage_ptr__);
      local_158 = 0;
      (*(local_170.memoryResource)->_vptr_memory_resource[3])
                (local_170.memoryResource,local_168,local_160 << 2,4);
      local_178 = 0;
      (*(local_190.memoryResource)->_vptr_memory_resource[3])
                (local_190.memoryResource,local_188,local_180 * 2,2);
      local_198 = 0;
      (*(local_1b0.memoryResource)->_vptr_memory_resource[3])
                (local_1b0.memoryResource,local_1a8,local_1a0,1);
      pbrt::
      InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~InlinedVector((InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_258);
      uVar42 = uVar42 + 1;
    } while (uVar42 != nLevels);
  }
  if (0 < (__return_storage_ptr__->resolution).super_Tuple2<pbrt::Point2,_int>.y) {
    local_350 = 0;
    do {
      if (0 < (__return_storage_ptr__->resolution).super_Tuple2<pbrt::Point2,_int>.x) {
        uVar44 = 0;
        do {
          PVar47.super_Tuple2<pbrt::Point2,_int> =
               (Tuple2<pbrt::Point2,_int>)(local_350 << 0x20 | uVar44);
          pbrt::Image::GetChannels
                    ((ImageChannelValues *)local_268,in,PVar47,local_328,(WrapMode2D)0x200000002);
          lVar46 = 0;
          do {
            FVar67 = pbrt::Image::GetChannel
                               (__return_storage_ptr__,PVar47,(int)lVar46,(WrapMode2D)0x200000002);
            pfVar41 = (float *)local_268._8_8_;
            if ((float *)local_268._8_8_ == (float *)0x0) {
              pfVar41 = (float *)local_258;
            }
            pbrt::Image::SetChannel
                      (__return_storage_ptr__,PVar47,(int)lVar46,FVar67 * pfVar41[lVar46]);
            lVar46 = lVar46 + 1;
          } while (lVar46 != 3);
          local_248._8_8_ = 0;
          (**(code **)(*(long *)local_268._0_8_ + 0x18))
                    (local_268._0_8_,local_268._8_8_,local_248._0_8_ << 2,4);
          uVar44 = uVar44 + 1;
        } while ((long)uVar44 <
                 (long)(__return_storage_ptr__->resolution).super_Tuple2<pbrt::Point2,_int>.x);
      }
      local_350 = local_350 + 1;
    } while (local_350 < (__return_storage_ptr__->resolution).super_Tuple2<pbrt::Point2,_int>.y);
  }
  if (local_2c0.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_2c0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_2c0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_2c0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  sStack_38 = 0;
  (*(local_50.memoryResource)->_vptr_memory_resource[3])
            (local_50.memoryResource,local_48._0_8_,local_48._8_8_ << 2,4);
  sStack_58 = 0;
  (*(local_70.memoryResource)->_vptr_memory_resource[3])
            (local_70.memoryResource,local_68._0_8_,local_68._8_8_ * 2,2);
  sStack_78 = 0;
  (*(*(_func_int ***)local_148._184_8_)[3])(local_148._184_8_,local_148._192_8_,sStack_80,1);
  pbrt::
  InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~InlinedVector((InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)(local_148 + 0x10));
  return __return_storage_ptr__;
}

Assistant:

Image denoiseImage(const Image &in, const ImageChannelDesc &Ldesc,
                   const Image &varianceImage, const ImageChannelDesc &albedoDesc,
                   const ImageChannelDesc &zDesc, const ImageChannelDesc &deltaZDesc,
                   const ImageChannelDesc &nDesc, int halfWidth, int nLevels) {
    Image illum(PixelFormat::Float, in.Resolution(), {"R", "G", "B"});
    for (int y = 0; y < in.Resolution().y; ++y)
        for (int x = 0; x < in.Resolution().x; ++x) {
            ImageChannelValues albedo = in.GetChannels({x, y}, albedoDesc);
            ImageChannelValues L = in.GetChannels({x, y}, Ldesc);
            for (int c = 0; c < 3; ++c)
                if (albedo[c] > 0)
                    illum.SetChannel({x, y}, c, L[c] / albedo[c]);
                else
                    illum.SetChannel({x, y}, c, L[c]);
        }

    std::vector<Float> f(halfWidth + 1, 0.);
    for (int i = 0; i <= halfWidth; ++i)
        f[i] = FastExp(-Float(i) / halfWidth * 3.f);

    static int call = -1;
    ++call;

    Image currentImage = std::move(illum);
    for (int i = 0; i < nLevels; ++i) {
        int delta = 1 << i;  // A-Trous step between samples.

        Image filtered(PixelFormat::Float, in.Resolution(), {"R", "G", "B"});
        // Image wImage(PixelFormat::Float, in.Resolution(), 3, "Wp,Wn,Wc");
        // Image dzImage(PixelFormat::Float, in.Resolution(), 1, "Y");

        ParallelFor(0, currentImage.Resolution().y, [&](int64_t start, int64_t end) {
            for (int y = start; y < end; ++y) {
                for (int x = 0; x < currentImage.Resolution().x; ++x) {
                    float wsum = 0;
                    ImageChannelValues c = currentImage.GetChannels({x, y});

                    Float z = in.GetChannels({x, y}, zDesc);
                    // FIXME: hack multiply to cancel out scaled ray
                    // differentials...
                    Float dzdx = 8 * in.GetChannels({x, y}, deltaZDesc)[0];
                    Float dzdy = 8 * in.GetChannels({x, y}, deltaZDesc)[1];

                    ImageChannelValues nChan = in.GetChannels({x, y}, nDesc);
                    Normal3f n = Normal3f(nChan[0], nChan[1], nChan[2]);
                    if (n == Normal3f(0, 0, 0))
                        // background pixel
                        continue;

                    Float pixelVariance = varianceImage.GetChannel({x, y}, 0);
                    float result[3] = {0.f};
                    float wpSum = 0, wnSum = 0, wcSum = 0;
                    // if (pixelVariance > .001) {
                    // pixelVariance = std::max<Float>(pixelVariance,
                    // .000001); {
                    {
                        // Higher sigma -> more blur
                        // Float sigma_y = .05;
                        Float sigma_z = .005;

                        // sigma_y = pixelVariance * 50;
                        // sigma_y = std::sqrt(std::sqrt(pixelVariance)) *
                        // 10 * sigmaYScale;

                        for (int dy = -halfWidth * delta; dy <= halfWidth * delta;
                             dy += delta) {
                            if (y + dy < 0 || y + dy >= currentImage.Resolution().y)
                                continue;
                            for (int dx = -halfWidth * delta; dx <= halfWidth * delta;
                                 dx += delta) {
                                if (x + dx < 0 || x + dx >= currentImage.Resolution().x)
                                    continue;
                                ImageChannelValues co =
                                    currentImage.GetChannels({x + dx, y + dy});
                                Float dc2 = (Sqr(c[0] - co[0]) + Sqr(c[1] - co[1]) +
                                             Sqr(c[2] - co[2]));  // squared color
                                                                  // difference
                                Float otherVariance =
                                    varianceImage.GetChannel({x + dx, y + dy}, 0);
                                Float d2 =
                                    std::max<Float>(0, dc2 - (pixelVariance +
                                                              std::min(pixelVariance,
                                                                       otherVariance))) /
                                    (1e-4 + 0.36f * (pixelVariance + otherVariance));

                                Float zo = in.GetChannels({x + dx, y + dy}, zDesc);
                                ImageChannelValues noChan =
                                    in.GetChannels({x + dx, y + dy}, nDesc);
                                Normal3f no = Normal3f(noChan[0], noChan[1], noChan[2]);
                                if (no == Normal3f(0, 0, 0))
                                    // background pixel;
                                    continue;

                                Float zp = z + dx * dzdx + dy * dzdy;
                                Float dz = (z - zp) / ((z + zp) * 0.5f);

                                // Assume camera space position...
                                Float wp = Gaussian(dz, 0, sigma_z) *
                                           f[std::abs(dy / delta)] *
                                           f[std::abs(dx / delta)];
                                Float wn = Pow<32>(std::max<float>(0, Dot(n, no)));
                                Float wc =
                                    FastExp(-d2 / 90);  // Gaussian(dc, 0, sigma_y);
                                CHECK(!std::isnan(wc));
                                wpSum += wp;
                                wnSum += wn;
                                wcSum += wc;
                                Float w = wp * wn * wc;

                                // CO fprintf(stderr, "(%d, %d) dc2 %f var
                                // %f other var %f -> d2 %f\n", CO x, y,
                                // dc2, pixelVariance, otherVariance, d2);

                                CHECK(!std::isnan(w));
                                if (w == 0)
                                    continue;

                                for (int c = 0; c < 3; ++c) {
                                    result[c] +=
                                        w * currentImage.GetChannel({x + dx, y + dy}, c);
                                    CHECK(!std::isnan(result[c]));
                                }
                                wsum += w;
                            }
                        }
                    }
                    for (int c = 0; c < 3; ++c)
                        if (wsum > 0) {
                            filtered.SetChannel({x, y}, c, result[c] / wsum);
                            // wImage.SetChannels({x, y}, {wpSum, wnSum,
                            // wcSum});
                        } else
                            filtered.SetChannel({x, y}, c,
                                                currentImage.GetChannel({x, y}, c));
                }
            }
        });

        // filtered.Write(StringPrintf("filtered-%d-%d.exr", call, i));
        // wImage.Write(StringPrintf("weights%d.exr", i));
        //        if (i == 0)
        //  dzImage.Write("dz.exr");

        pstd::swap(filtered, currentImage);
    }

    // static int i = 0;
    // currentImage.Write(StringPrintf("filteredillum-%d.exr", i++));

    // reincorporate albedo
    for (int y = 0; y < currentImage.Resolution().y; ++y)
        for (int x = 0; x < currentImage.Resolution().x; ++x) {
            ImageChannelValues albedo = in.GetChannels({x, y}, albedoDesc);
            for (int c = 0; c < 3; ++c)
                currentImage.SetChannel({x, y}, c,
                                        currentImage.GetChannel({x, y}, c) * albedo[c]);
        }

    return currentImage;
}